

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O1

SQRESULT sqstd_getfile(HSQUIRRELVM v,SQInteger idx,SQFILE *file)

{
  long lVar1;
  SQRESULT SVar2;
  SQFile *fileobj;
  
  lVar1 = sq_getinstanceup();
  if (lVar1 < 0) {
    SVar2 = sq_throwerror(v,"not a file");
  }
  else {
    *file = pvRam0000000000000008;
    SVar2 = 0;
  }
  return SVar2;
}

Assistant:

SQRESULT sqstd_getfile(HSQUIRRELVM v, SQInteger idx, SQFILE *file)
{
    SQFile *fileobj = NULL;
    if(SQ_SUCCEEDED(sq_getinstanceup(v,idx,(SQUserPointer*)&fileobj,(SQUserPointer)SQSTD_FILE_TYPE_TAG))) {
        *file = fileobj->GetHandle();
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("not a file"));
}